

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  output_symbol sym;
  output_symbol local_8;
  
  if ((num_bits != 0) &&
     (this->m_total_bits_written = this->m_total_bits_written + num_bits,
     this->m_simulate_encoding == false)) {
    local_8.m_num_bits = (short)num_bits;
    local_8.m_bits = bits;
    local_8.m_arith_prob0 = 0;
    vector<crnlib::symbol_codec::output_symbol>::push_back(&this->m_output_syms,&local_8);
  }
  return;
}

Assistant:

void symbol_codec::record_put_bits(uint bits, uint num_bits)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        CRNLIB_ASSERT(num_bits <= 25);
        CRNLIB_ASSERT(m_bit_count >= 25);

        if (!num_bits)
        {
            return;
        }

        m_total_bits_written += num_bits;

        if (!m_simulate_encoding)
        {
            output_symbol sym;
            sym.m_bits = bits;
            sym.m_num_bits = (uint16)num_bits;
            sym.m_arith_prob0 = 0;
            m_output_syms.push_back(sym);
        }
    }